

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O1

int __thiscall MeCab::POSIDGenerator::open(POSIDGenerator *this,char *__file,int __oflag,...)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  POSIDGenerator *this_00;
  Iconv *this_01;
  char *__s;
  char cVar4;
  size_t sVar5;
  istream *piVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ostream *poVar8;
  undefined8 uVar9;
  ulong uVar10;
  char **ppcVar11;
  char *pcVar12;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  bool bVar16;
  string line;
  char *col [2];
  ifstream ifs;
  die local_279;
  string local_278;
  POSIDGenerator *local_258;
  Iconv *local_250;
  char *local_248 [2];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,__file,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_278._M_string_length = 0;
    local_278.field_2._M_local_buf[0] = '\0';
    local_258 = this;
    local_250 = ___oflag;
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      this_01 = local_250;
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_278,cVar4);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      if (this_01 != (Iconv *)0x0) {
        Iconv::convert(this_01,&local_278);
      }
      _Var13._M_p = local_278._M_dataplus._M_p;
      sVar5 = strlen(local_278._M_dataplus._M_p);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(_Var13._M_p + sVar5);
      ppcVar11 = local_248;
      uVar10 = 0;
      do {
        paVar2 = paVar7;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var13._M_p;
        if (1 < uVar10) break;
        for (; paVar14 = paVar7, paVar3 != paVar7;
            paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar3->_M_local_buf + 1)) {
          if (paVar3->_M_local_buf[0] != ' ') {
            lVar15 = 0;
            do {
              bVar16 = lVar15 == 1;
              paVar14 = paVar2;
              if (bVar16) goto LAB_0013ce93;
              lVar1 = lVar15 + 1;
              lVar15 = lVar15 + 1;
            } while (paVar3->_M_local_buf[0] != " \t"[lVar1]);
          }
          bVar16 = false;
          paVar14 = paVar3;
LAB_0013ce93:
          if (!bVar16) break;
          paVar2 = paVar14;
        }
        paVar14->_M_local_buf[0] = '\0';
        if (*_Var13._M_p != '\0') {
          *ppcVar11 = _Var13._M_p;
          ppcVar11 = ppcVar11 + 1;
          uVar10 = uVar10 + 1;
        }
        _Var13._M_p = paVar14->_M_local_buf + 1;
      } while (paVar14 != paVar7);
      if (uVar10 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                   ,0x79);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xdb);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"n == 2",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"format error: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_278._M_dataplus._M_p,local_278._M_string_length);
        die::~die(&local_279);
      }
      __s = local_248[1];
      cVar4 = *local_248[1];
      this_00 = local_258;
      pcVar12 = local_248[1];
      while (local_258 = this_00, cVar4 != '\0') {
        pcVar12 = pcVar12 + 1;
        if (9 < (byte)(cVar4 - 0x30U)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                     ,0x79);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xdd);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"*p >= \'0\' && *p <= \'9\'",0x16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"not a number: ",0xe);
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar5);
          die::~die(&local_279);
        }
        this_00 = local_258;
        cVar4 = *pcVar12;
      }
      std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::resize
                ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)this_00,
                 ((long)(((_Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                           *)&this_00->rewrite_)->_M_impl).super__Vector_impl_data._M_finish -
                  (long)(((_Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                           *)&this_00->rewrite_)->_M_impl).super__Vector_impl_data._M_start >> 4) *
                 -0x5555555555555555 + 1);
      RewritePattern::set_pattern
                ((((_Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)
                  &this_00->rewrite_)->_M_impl).super__Vector_impl_data._M_finish + -1,local_248[0],
                 __s);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
  }
  else {
    if (__file == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x17b498);
    }
    else {
      sVar5 = strlen(__file);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__file,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," is not found. minimum setting is used",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::resize
              ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)this,1);
    RewritePattern::set_pattern
              ((this->rewrite_).
               super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
               super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1,"*","1");
  }
  uVar9 = std::ifstream::~ifstream(local_238);
  return (int)CONCAT71((int7)((ulong)uVar9 >> 8),1);
}

Assistant:

bool POSIDGenerator::open(const char *filename,
                          Iconv *iconv) {
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    std::cerr << filename
              << " is not found. minimum setting is used" << std::endl;
    rewrite_.resize(1);
    rewrite_.back().set_pattern("*", "1");
    return true;
  }

  std::string line;
  char *col[2];
  while (std::getline(ifs, line)) {
    if (iconv) iconv->convert(&line);
    const size_t n = tokenize2(const_cast<char *>(line.c_str()),
                               " \t", col, 2);
    CHECK_DIE(n == 2) << "format error: " << line;
    for (char *p = col[1]; *p; ++p) {
      CHECK_DIE(*p >= '0' && *p <= '9') << "not a number: " << col[1];
    }
    rewrite_.resize(rewrite_.size() + 1);
    rewrite_.back().set_pattern(col[0], col[1]);
  }
  return true;
}